

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O1

Am_Object copy_command_tree(Am_Object *command_obj)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Wrapper *pAVar3;
  Am_Object *in_RSI;
  Am_Object child_copy;
  Am_Object parent;
  Am_Object child;
  Am_Value value;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value local_50;
  Am_Object_Data *local_40;
  Am_Object local_38;
  
  local_40 = (Am_Object_Data *)command_obj;
  Am_Object::Copy_Value_Only((Am_Object *)&local_50,(char *)in_RSI);
  Am_Object::operator=(in_RSI,(Am_Object *)&local_50);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  local_58.data = (Am_Object_Data *)0x0;
  local_60.data = (Am_Object_Data *)0x0;
  local_68.data = (Am_Object_Data *)0x0;
  Am_Object::operator=(&local_60,in_RSI);
  local_50.type = 0;
  local_50.value.wrapper_value = (Am_Wrapper *)0x0;
  while( true ) {
    in_value = Am_Object::Get(&local_60,0x167,1);
    Am_Value::operator=(&local_50,in_value);
    bVar2 = Am_Value::Valid(&local_50);
    pAVar1 = local_40;
    if (!bVar2 || local_50.type != 0xa001) break;
    Am_Object::operator=(&local_58,&local_50);
    Am_Object::Copy_Value_Only(&local_38,(char *)&local_58);
    Am_Object::operator=(&local_68,&local_38);
    Am_Object::~Am_Object(&local_38);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_68);
    Am_Object::Set(&local_60,0x167,pAVar3,0);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_60);
    Am_Object::Set(&local_68,0x154,pAVar3,0);
    Am_Object::operator=(&local_60,&local_68);
  }
  Am_Object::Am_Object((Am_Object *)local_40,in_RSI);
  Am_Value::~Am_Value(&local_50);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  return (Am_Object)pAVar1;
}

Assistant:

Am_Object
copy_command_tree(Am_Object command_obj)
{
  command_obj = command_obj.Copy_Value_Only();
  Am_Object child, parent, child_copy;
  parent = command_obj;
  Am_Value value;
  while (true) {
    value = parent.Peek(Am_IMPLEMENTATION_CHILD);
    if (value.Valid() && value.type == Am_OBJECT) {
      child = value;
      child_copy = child.Copy_Value_Only();
      parent.Set(Am_IMPLEMENTATION_CHILD, child_copy);
      child_copy.Set(Am_IMPLEMENTATION_PARENT, parent);
      parent = child_copy;
    } else
      break; //leave loop
  }
  return command_obj;
}